

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_interface.cpp
# Opt level: O3

int isotree_serialize_to_file(void *isotree_model,FILE *output)

{
  long lVar1;
  char *pcVar2;
  
  if (isotree_model == (void *)0x0) {
    pcVar2 = "Passed NULL \'isotree_model\' to \'isotree_serialize_to_file\'.";
    lVar1 = 0x3b;
  }
  else {
    if (output != (FILE *)0x0) {
      isotree::IsolationForest::serialize((IsolationForest *)isotree_model,output);
      return 0;
    }
    pcVar2 = "Passed invalid file handle to \'isotree_serialize_to_file\'.";
    lVar1 = 0x3a;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar2,lVar1);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
  std::ostream::put('@');
  std::ostream::flush();
  return 1;
}

Assistant:

ISOTREE_EXPORTED
int isotree_serialize_to_file(const void *isotree_model, FILE *output)
{
    if (!isotree_model) {
        cerr << "Passed NULL 'isotree_model' to 'isotree_serialize_to_file'." << std::endl;
        return IsoTreeError;
    }
    if (!output) {
        cerr << "Passed invalid file handle to 'isotree_serialize_to_file'." << std::endl;
        return IsoTreeError;
    }

    const IsolationForest *model = (const IsolationForest*)isotree_model;
    
    try
    {
        model->serialize(output);
        return IsoTreeSuccess;
    }

    catch (std::exception &e)
    {
        cerr << e.what();
        cerr.flush();
    }

    return IsoTreeError;
}